

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transportParser.h
# Opt level: O2

void __thiscall IO::TransportParser::~TransportParser(TransportParser *this)

{
  std::__cxx11::string::~string((string *)&this->transportfilestring_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TransportParser(){}